

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.hpp
# Opt level: O2

void __thiscall
duckdb::PartitionedTupleData::ComputePartitionIndices
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state,DataChunk *input,
          SelectionVector *append_sel,idx_t append_count)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"ComputePartitionIndices for this type of PartitionedTupleData",
             &local_39);
  NotImplementedException::NotImplementedException(this_00,&local_38);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual void ComputePartitionIndices(PartitionedTupleDataAppendState &state, DataChunk &input,
	                                     const SelectionVector &append_sel, const idx_t append_count) {
		throw NotImplementedException("ComputePartitionIndices for this type of PartitionedTupleData");
	}